

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  int i;
  long lVar1;
  int i_1;
  int nums [5];
  uint local_38 [8];
  
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[4] = 5;
  lVar1 = 0;
  do {
    local_38[lVar1] = local_38[lVar1] + 1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    printf("%i ",(ulong)local_38[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  putchar(10);
  print_two_dimensions((int (*) [5])&DAT_00102030,2,5);
  lVar1 = 0;
  do {
    printf("%i ",(ulong)*(uint *)((long)&DAT_00102060 + lVar1));
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x28);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};
    int len = sizeof(nums)/sizeof(int);

    add_one_to_array(nums, len);

    for (int i=0; i<len; i++) {
        printf("%i ", nums[i]);
    }
    printf("\n");

    int nums2d[2][5] = {
        {1, 2, 3, 4, 5},
        {6, 7, 8, 9, 10}
    };
    int nums2d_2[10] = {
            1, 2, 3, 4, 5, 6, 7, 8, 9, 10
    };

    print_two_dimensions(nums2d, 2, 5);

    print_one_dimension(nums2d_2, sizeof(nums2d_2)/sizeof(int));

    return 0;
}